

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigpipe.h
# Opt level: O0

void sigpipe_apply(Curl_easy *data,sigpipe_ignore *ig)

{
  sigpipe_ignore *ig_local;
  Curl_easy *data_local;
  
  if (((uint)(*(ulong *)&(data->set).field_0x8ca >> 0x1f) & 1) != (uint)(ig->no_signal & 1)) {
    sigpipe_restore(ig);
    sigpipe_ignore(data,ig);
  }
  return;
}

Assistant:

static void sigpipe_apply(struct Curl_easy *data,
                          struct sigpipe_ignore *ig)
{
  if(data->set.no_signal != ig->no_signal) {
    sigpipe_restore(ig);
    sigpipe_ignore(data, ig);
  }
}